

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tools_common.c
# Opt level: O0

void aom_img_downshift(aom_image_t *dst,aom_image_t *src,int down_shift)

{
  uint *in_RDI;
  aom_image_t *in_stack_00000018;
  aom_image_t *in_stack_00000020;
  
  if ((*in_RDI & 0x800) == 0) {
    lowbd_img_downshift(in_stack_00000020,in_stack_00000018,dst._4_4_);
  }
  else {
    highbd_img_downshift(in_stack_00000020,in_stack_00000018,dst._4_4_);
  }
  return;
}

Assistant:

void aom_img_downshift(aom_image_t *dst, const aom_image_t *src,
                       int down_shift) {
  if (dst->fmt & AOM_IMG_FMT_HIGHBITDEPTH) {
    highbd_img_downshift(dst, src, down_shift);
  } else {
    lowbd_img_downshift(dst, src, down_shift);
  }
}